

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void drawScene(scene_t *scene,float *view,float *projection)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM1IPROC p_Var2;
  PFNGLUNIFORM3FVPROC p_Var3;
  GLint GVar4;
  float *projection_local;
  float *view_local;
  scene_t *scene_local;
  
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClear)(0x4100);
  (*glad_glEnable)(0xb71);
  (*glad_glDepthFunc)(0x203);
  (*glad_glUseProgram)((scene->mesh).program);
  (*glad_glUniformMatrix4fv)((scene->mesh).u_projection,1,'\0',projection);
  (*glad_glUniformMatrix4fv)((scene->mesh).u_view,1,'\0',view);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_sh_lut");
  (*p_Var2)(GVar4,3);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_log_lut");
  (*p_Var2)(GVar4,1);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_ab_lut");
  (*p_Var2)(GVar4,2);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_sphere");
  (*p_Var2)(GVar4,4);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_ratio");
  (*p_Var2)(GVar4,5);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_sparse");
  (*p_Var2)(GVar4,0xf);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_sqrsparse");
  (*p_Var2)(GVar4,0x10);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_LH");
  (*p_Var2)(GVar4,8);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_LHcubemap");
  (*p_Var2)(GVar4,0);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"albedo_map");
  (*p_Var2)(GVar4,0x14);
  p_Var1 = glad_glUniform1f;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"max_magn");
  (*p_Var1)(GVar4,(scene->mesh).max_magn);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"gammasize");
  (*p_Var2)(GVar4,(scene->mesh).gammasize);
  p_Var2 = glad_glUniform1i;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"sqrgammasize");
  (*p_Var2)(GVar4,(scene->mesh).sqrgammasize);
  p_Var3 = glad_glUniform3fv;
  GVar4 = (*glad_glGetUniformLocation)((scene->mesh).program,"objcolor");
  (*p_Var3)(GVar4,10,&obj_color[0].x);
  (*glad_glBindVertexArray)((scene->mesh).vao);
  (*glad_glDrawArrays)(4,0,(scene->mesh).vertices);
  return;
}

Assistant:

static void drawScene(scene_t *scene, float *view, float *projection)
{
	glClearColor(0.0f, 0.0f, 0.0f, 1.0f );
	glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glDepthFunc(GL_LEQUAL);
	//glDisable(GL_CULL_FACE);

	// mesh
	glUseProgram(scene->mesh.program);
	glUniformMatrix4fv(scene->mesh.u_projection, 1, GL_FALSE, projection);
	glUniformMatrix4fv(scene->mesh.u_view, 1, GL_FALSE, view);
	// textures
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_sh_lut"), 3);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_log_lut"), 1);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_ab_lut"), 2);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_sphere"), 4);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_ratio"), 5);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_sparse"), 15);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_sqrsparse"), 16);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_LH"), 8);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "u_LHcubemap"), 0);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "albedo_map"), 20);
	// variables
	glUniform1f(glGetUniformLocation(scene->mesh.program, "max_magn"), scene->mesh.max_magn);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "gammasize"), scene->mesh.gammasize);
	glUniform1i(glGetUniformLocation(scene->mesh.program, "sqrgammasize"), scene->mesh.sqrgammasize);
	// color
	glUniform3fv(glGetUniformLocation(scene->mesh.program, "objcolor"), 10, &obj_color[0].x);
	// vertices
	glBindVertexArray(scene->mesh.vao);
	glDrawArrays(GL_TRIANGLES, 0, scene->mesh.vertices);
}